

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_format_specs<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
          (internal *this,null_terminating_iterator<char> it,
          specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
          *handler)

{
  internal iVar1;
  internal iVar2;
  alignment align;
  bool bVar3;
  uint uVar4;
  internal *piVar5;
  basic_format_specs<char> *handler_00;
  bool bVar6;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  *this_00;
  bool bVar7;
  char *message;
  long lVar8;
  internal *this_01;
  null_terminating_iterator<char> nVar9;
  null_terminating_iterator<char> nVar10;
  null_terminating_iterator<char> nVar11;
  null_terminating_iterator<char> local_30;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  *local_20;
  
  this_00 = (specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
             *)it.end_;
  nVar11.ptr_ = (internal *)it.ptr_;
  if (this == nVar11.ptr_) goto LAB_001b3806;
  iVar1 = *this;
  handler_00 = (basic_format_specs<char> *)(ulong)(byte)iVar1;
  if ((iVar1 == (internal)0x0) || (iVar1 == (internal)0x7d)) goto LAB_001b3806;
  lVar8 = 1;
  bVar6 = false;
  bVar3 = true;
  do {
    bVar7 = bVar3;
    local_30.ptr_ = (char *)this;
    local_30.end_ = (char *)nVar11.ptr_;
    if (this + lVar8 != nVar11.ptr_) {
      iVar2 = this[lVar8];
      if (iVar2 == (internal)0x3c) {
        align = ALIGN_LEFT;
      }
      else if (iVar2 == (internal)0x5e) {
        align = ALIGN_CENTER;
      }
      else if (iVar2 == (internal)0x3e) {
        align = ALIGN_RIGHT;
      }
      else {
        if (iVar2 != (internal)0x3d) goto LAB_001b3843;
        align = ALIGN_NUMERIC;
      }
      if (bVar6) {
        this = this + 1;
      }
      else {
        if (iVar1 == (internal)0x7b) {
          dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
          ::on_error((dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                      *)this_00,"invalid fill character \'{\'");
          goto LAB_001b3806;
        }
        this = this + 2;
        handler_00 = (this_00->
                     super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                     ).super_specs_setter<char>.specs_;
        (handler_00->super_align_spec).fill_ = (int)(char)iVar1;
      }
      local_30.ptr_ = (char *)this;
      specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
      ::on_align(this_00,align);
      break;
    }
LAB_001b3843:
    bVar6 = true;
    lVar8 = 0;
    bVar3 = false;
  } while (bVar7);
  if (this != nVar11.ptr_) {
    iVar1 = *this;
    if (iVar1 == (internal)0x20) {
      specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
      ::on_space(this_00);
    }
    else if (iVar1 == (internal)0x2d) {
      specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
      ::on_minus(this_00);
    }
    else {
      if (iVar1 != (internal)0x2b) goto LAB_001b38de;
      specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
      ::on_plus(this_00);
    }
    this = this + 1;
    local_30.ptr_ = (char *)this;
  }
LAB_001b38de:
  if ((this != nVar11.ptr_) && (*this == (internal)0x23)) {
    specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
    ::on_hash(this_00);
    this = this + 1;
    local_30.ptr_ = (char *)this;
  }
  if ((this != nVar11.ptr_) && (*this == (internal)0x30)) {
    specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
    ::on_zero(this_00);
    this = this + 1;
    local_30.ptr_ = (char *)this;
  }
  if ((this == nVar11.ptr_) || (iVar1 = *this, (char)iVar1 < '0')) {
LAB_001b397f:
    local_30.ptr_ = (char *)this;
    if (((internal *)local_30.ptr_ != nVar11.ptr_) && ((internal)*local_30.ptr_ == (internal)0x2e))
    {
      piVar5 = (internal *)local_30.ptr_ + 1;
      if ((piVar5 == nVar11.ptr_) || (iVar1 = *piVar5, (char)iVar1 < '0')) {
LAB_001b3a43:
        message = "missing precision specifier";
        local_30.ptr_ = (char *)piVar5;
        goto LAB_001b3a4a;
      }
      if ((byte)iVar1 < 0x3a) {
        local_30.ptr_ = (char *)piVar5;
        uVar4 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                          (&local_30,this_00);
        ((this_00->
         super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
         ).super_specs_setter<char>.specs_)->precision_ = uVar4;
      }
      else {
        if (iVar1 != (internal)0x7b) goto LAB_001b3a43;
        this_01 = (internal *)local_30.ptr_ + 2;
        nVar10.end_ = (char *)&local_20;
        nVar10.ptr_ = (char *)nVar11.ptr_;
        local_30.ptr_ = (char *)piVar5;
        local_20 = this_00;
        nVar11 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>>
                           (this_01,nVar10,
                            (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
                             *)handler_00);
        local_30.end_ = nVar11.end_;
        local_30.ptr_ = (char *)(nVar11.ptr_ + 1);
        if ((nVar11.ptr_ == (internal *)local_30.end_) || (*nVar11.ptr_ != (internal)0x7d))
        goto LAB_001b3a3a;
      }
      specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
      ::end_precision(this_00);
      nVar11.ptr_ = (internal *)local_30.end_;
    }
    this = (internal *)local_30.ptr_;
    if ((((internal *)local_30.ptr_ != nVar11.ptr_) && ((internal)*local_30.ptr_ != (internal)0x0))
       && ((internal)*local_30.ptr_ != (internal)0x7d)) {
      this = (internal *)local_30.ptr_ + 1;
      ((this_00->
       super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
       ).super_specs_setter<char>.specs_)->type_ = *local_30.ptr_;
    }
  }
  else {
    if ((byte)iVar1 < 0x3a) {
      uVar4 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                        (&local_30,this_00);
      handler_00 = (this_00->
                   super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                   ).super_specs_setter<char>.specs_;
      (handler_00->super_align_spec).width_ = uVar4;
      nVar11.ptr_ = (internal *)local_30.end_;
      this = (internal *)local_30.ptr_;
      goto LAB_001b397f;
    }
    if (iVar1 != (internal)0x7b) goto LAB_001b397f;
    nVar11.end_ = (char *)&local_20;
    local_20 = this_00;
    nVar10 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>>
                       (this + 1,nVar11,
                        (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
                         *)handler_00);
    nVar11.ptr_ = (internal *)nVar10.end_;
    piVar5 = (internal *)nVar10.ptr_;
    local_30.ptr_ = (char *)(piVar5 + 1);
    local_30.end_ = (char *)nVar11.ptr_;
    if ((piVar5 != nVar11.ptr_) && (this = (internal *)local_30.ptr_, *piVar5 == (internal)0x7d))
    goto LAB_001b397f;
LAB_001b3a3a:
    message = "invalid format string";
LAB_001b3a4a:
    dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>::
    on_error((dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
              *)this_00,message);
    nVar11.ptr_ = (internal *)local_30.end_;
    this = (internal *)local_30.ptr_;
  }
LAB_001b3806:
  nVar9.end_ = (char *)nVar11.ptr_;
  nVar9.ptr_ = (char *)this;
  return nVar9;
}

Assistant:

FMT_CONSTEXPR Iterator parse_format_specs(Iterator it, SpecHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || !c)
    return it;

  // Parse fill and alignment.
  alignment align = ALIGN_DEFAULT;
  int i = 1;
  do {
    auto p = it + i;
    switch (*p) {
      case '<':
        align = ALIGN_LEFT;
        break;
      case '>':
        align = ALIGN_RIGHT;
        break;
      case '=':
        align = ALIGN_NUMERIC;
        break;
      case '^':
        align = ALIGN_CENTER;
        break;
    }
    if (align != ALIGN_DEFAULT) {
      if (p != it) {
        if (c == '{') {
          handler.on_error("invalid fill character '{'");
          return it;
        }
        it += 2;
        handler.on_fill(c);
      } else ++it;
      handler.on_align(align);
      break;
    }
  } while (--i >= 0);

  // Parse sign.
  switch (*it) {
    case '+':
      handler.on_plus();
      ++it;
      break;
    case '-':
      handler.on_minus();
      ++it;
      break;
    case ' ':
      handler.on_space();
      ++it;
      break;
  }

  if (*it == '#') {
    handler.on_hash();
    ++it;
  }

  // Parse zero flag.
  if (*it == '0') {
    handler.on_zero();
    ++it;
  }

  // Parse width.
  if ('0' <= *it && *it <= '9') {
    handler.on_width(parse_nonnegative_int(it, handler));
  } else if (*it == '{') {
    it = parse_arg_id(it + 1, width_adapter<SpecHandler, char_type>(handler));
    if (*it++ != '}') {
      handler.on_error("invalid format string");
      return it;
    }
  }

  // Parse precision.
  if (*it == '.') {
    ++it;
    if ('0' <= *it && *it <= '9') {
      handler.on_precision(parse_nonnegative_int(it, handler));
    } else if (*it == '{') {
      it = parse_arg_id(
            it + 1, precision_adapter<SpecHandler, char_type>(handler));
      if (*it++ != '}') {
        handler.on_error("invalid format string");
        return it;
      }
    } else {
      handler.on_error("missing precision specifier");
      return it;
    }
    handler.end_precision();
  }

  // Parse type.
  if (*it != '}' && *it)
    handler.on_type(*it++);
  return it;
}